

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_aa461::CreatePhi
                    (VmModule *module,SynBase *source,VmInstruction *valueA,VmInstruction *valueB)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType type;
  VmValue *in_stack_ffffffffffffffc0;
  VmInstruction *valueB_local;
  VmInstruction *valueA_local;
  SynBase *source_local;
  VmModule *module_local;
  
  if (valueA == (VmInstruction *)0x0) {
    __assert_fail("valueA",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x33f,
                  "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
                 );
  }
  if (valueB != (VmInstruction *)0x0) {
    bVar1 = VmType::operator==(&(valueA->super_VmValue).type,&(valueB->super_VmValue).type);
    if (!bVar1) {
      __assert_fail("valueA->type == valueB->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x341,
                    "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
                   );
    }
    type.structType = (TypeBase *)0x4d;
    type._0_8_ = (valueA->super_VmValue).type.structType;
    pVVar2 = CreateInstruction((anon_unknown_dwarf_aa461 *)module,(VmModule *)source,
                               *(SynBase **)&(valueA->super_VmValue).type,type,
                               (VmInstructionType)valueA,&valueA->parent->super_VmValue,
                               &valueB->super_VmValue,&valueB->parent->super_VmValue,
                               in_stack_ffffffffffffffc0);
    return &pVVar2->super_VmValue;
  }
  __assert_fail("valueB",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x340,
                "VmValue *(anonymous namespace)::CreatePhi(VmModule *, SynBase *, VmInstruction *, VmInstruction *)"
               );
}

Assistant:

VmValue* CreatePhi(VmModule *module, SynBase *source, VmInstruction *valueA, VmInstruction *valueB)
	{
		assert(valueA);
		assert(valueB);
		assert(valueA->type == valueB->type);

		return CreateInstruction(module, source, valueA->type, VM_INST_PHI, valueA, valueA->parent, valueB, valueB->parent);
	}